

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

void __thiscall
miniros::ServicePublication::removeServiceClientLink
          (ServicePublication *this,ServiceClientLinkPtr *link)

{
  bool bVar1;
  __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
  in_RDI;
  __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
  it;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
  *in_stack_ffffffffffffff80;
  shared_ptr<miniros::ServiceClientLink> *in_stack_ffffffffffffff88;
  const_iterator __first;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __first._M_current = in_RDI._M_current + 0xc;
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::begin((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
           *)in_stack_ffffffffffffff78);
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::end((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
         *)in_stack_ffffffffffffff78);
  std::
  find<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>*,std::vector<std::shared_ptr<miniros::ServiceClientLink>,std::allocator<std::shared_ptr<miniros::ServiceClientLink>>>>,std::shared_ptr<miniros::ServiceClientLink>>
            ((__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
              )__first._M_current,in_RDI,in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::end((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
         *)in_stack_ffffffffffffff78);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff80,
                     (__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
                      *)in_stack_ffffffffffffff78);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>const*,std::vector<std::shared_ptr<miniros::ServiceClientLink>,std::allocator<std::shared_ptr<miniros::ServiceClientLink>>>>
    ::__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>*>
              ((__normal_iterator<const_std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
                *)((long)in_RDI._M_current + 0xc0),
               (__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
                *)in_stack_ffffffffffffff78);
    std::
    vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ::erase((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             *)in_RDI._M_current,__first);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4a9b61);
  return;
}

Assistant:

void ServicePublication::removeServiceClientLink(const ServiceClientLinkPtr& link)
{
  std::scoped_lock<std::mutex> lock(client_links_mutex_);

  auto it = std::find(client_links_.begin(), client_links_.end(), link);
  if (it != client_links_.end())
  {
    client_links_.erase(it);
  }
}